

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

void __thiscall soplex::SVectorBase<double>::add(SVectorBase<double> *this,int i,double *v)

{
  int iVar1;
  double *in_RDX;
  int in_ESI;
  SVectorBase<double> *in_RDI;
  int n;
  
  if ((*in_RDX != 0.0) || (NAN(*in_RDX))) {
    iVar1 = size(in_RDI);
    in_RDI->m_elem[iVar1].idx = in_ESI;
    in_RDI->m_elem[iVar1].val = *in_RDX;
    set_size(in_RDI,iVar1 + 1);
  }
  return;
}

Assistant:

void add(int i, const R& v)
   {
      assert(m_elem != nullptr);
      assert(size() < max());

      if(v != 0.0)
      {
         int n = size();

         m_elem[n].idx = i;
         m_elem[n].val = v;
         set_size(n + 1);

         assert(size() <= max());
      }
   }